

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginPopupEx(ImGuiID id,ImGuiWindowFlags extra_window_flags)

{
  int iVar1;
  bool bVar2;
  ImGuiContext *g;
  ulong uVar3;
  char *fmt;
  char name [20];
  char acStack_28 [32];
  
  iVar1 = (GImGui->BeginPopupStack).Size;
  if ((iVar1 < (GImGui->OpenPopupStack).Size) &&
     (uVar3 = (ulong)id, (GImGui->OpenPopupStack).Data[iVar1].PopupId == id)) {
    if (((uint)extra_window_flags >> 0x1c & 1) == 0) {
      fmt = "##Popup_%08x";
    }
    else {
      uVar3 = (ulong)(uint)GImGui->BeginMenuDepth;
      fmt = "##Menu_%02d";
    }
    ImFormatString(acStack_28,0x14,fmt,uVar3);
    bVar2 = Begin(acStack_28,(bool *)0x0,extra_window_flags | 0x4000000);
    if (!bVar2) {
      EndPopup();
    }
  }
  else {
    (GImGui->NextWindowData).Flags = 0;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginPopupEx(ImGuiID id, ImGuiWindowFlags extra_window_flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    char name[20];
    if (extra_window_flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, IM_ARRAYSIZE(name), "##Menu_%02d", g.BeginMenuDepth); // Recycle windows based on depth
    else
        ImFormatString(name, IM_ARRAYSIZE(name), "##Popup_%08x", id); // Not recycling, so we can close/open during the same frame

    bool is_open = Begin(name, NULL, extra_window_flags | ImGuiWindowFlags_Popup);
    if (!is_open) // NB: Begin can return false when the popup is completely clipped (e.g. zero size display)
        EndPopup();

    //g.CurrentWindow->FocusRouteParentWindow = g.CurrentWindow->ParentWindowInBeginStack;

    return is_open;
}